

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O0

char * json2map_setTokenValue(char *jsonString,jsmntok_t *token)

{
  char *__dest;
  long in_RSI;
  long in_RDI;
  char *buffer;
  
  __dest = (char *)calloc(1,(long)((*(int *)(in_RSI + 8) - *(int *)(in_RSI + 4)) + 1));
  memcpy(__dest,(void *)(in_RDI + *(int *)(in_RSI + 4)),
         (long)(*(int *)(in_RSI + 8) - *(int *)(in_RSI + 4)));
  return __dest;
}

Assistant:

static char *json2map_setTokenValue(char *jsonString, jsmntok_t *token) {
	DEBUG_TEXT("json2map_setTokenValue(%s, [jsmntok_t *])... ", jsonString);
	char *buffer;
	buffer = calloc(sizeof(char), token->end - token->start + 1);
	memcpy(buffer, jsonString + token->start, token->end - token->start);
	DEBUG_TEXT("json2map_setTokenValue(%s, [jsmntok_t *])... DONE", jsonString);
	return buffer;
}